

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_args.c
# Opt level: O1

int mpt_object_args(mpt_object *obj,mpt_iterator *args)

{
  mpt_type_t mVar1;
  undefined8 *puVar2;
  bool bVar3;
  char *__src;
  int iVar4;
  mpt_value *pmVar5;
  char *pcVar6;
  ulong __n;
  int iVar7;
  int unaff_R14D;
  void *ptr;
  char name [256];
  char *local_178;
  undefined8 uStack_170;
  mpt_value local_168;
  char *local_158;
  undefined8 uStack_150;
  mpt_object *local_148;
  undefined8 *local_140;
  char local_138 [264];
  
  local_158 = (char *)0x0;
  uStack_150 = 0;
  local_168._addr = (char **)0x0;
  local_168._type = 0;
  local_178 = (char *)0x0;
  uStack_170 = 0;
  iVar7 = 0;
  local_148 = obj;
  do {
    pmVar5 = (*args->_vptr->value)(args);
    if (pmVar5 == (mpt_value *)0x0) {
      return iVar7;
    }
    local_178 = (char *)0x0;
    local_168._type = 0;
    local_140 = (undefined8 *)pmVar5->_addr;
    mVar1 = pmVar5->_type;
    if (((mVar1 == 0x80) || (mVar1 == 0x801)) || (mVar1 - 0x100 < 0x700)) {
      puVar2 = (undefined8 *)*local_140;
      iVar4 = (**(code **)*puVar2)(puVar2,0x1a,&local_178);
      if ((iVar4 < 0) || (iVar4 = mpt_object_set_value(local_148,local_178,&local_168), iVar4 < 0))
      {
        local_168._type = 0;
        (**(code **)*puVar2)(puVar2,0x73,&local_178);
      }
    }
    if (local_168._type == 0) {
      if ((local_178 == (char *)0x0) &&
         (local_178 = mpt_data_tostring(&local_140,pmVar5->_type,(size_t *)0x0),
         local_178 == (char *)0x0)) {
LAB_00116fef:
        unaff_R14D = iVar7;
        if (iVar7 == 0) {
          unaff_R14D = -2;
        }
LAB_00116ffe:
        bVar3 = false;
      }
      else {
        __src = local_178;
        pcVar6 = strchr(local_178,0x3d);
        local_168._type = 0x73;
        if (pcVar6 != (char *)0x0) {
          local_158 = pcVar6 + 1;
          local_168._addr = &local_158;
          __n = (long)pcVar6 - (long)__src;
          if (__n < 0x100) {
            memcpy(local_138,__src,__n);
            local_138[__n] = '\0';
            local_178 = local_138;
          }
          else {
            unaff_R14D = iVar7;
            if (iVar7 == 0) {
              unaff_R14D = -0x11;
            }
          }
          if (__n < 0x100) goto LAB_00116fd6;
          goto LAB_00116ffe;
        }
        local_158 = (char *)0x0;
        local_168._addr = &local_158;
LAB_00116fd6:
        iVar4 = mpt_object_set_value(local_148,local_178,&local_168);
        bVar3 = true;
        if (iVar4 < 0) goto LAB_00116fef;
      }
      if (bVar3) goto LAB_00117004;
      bVar3 = false;
    }
    else {
LAB_00117004:
      iVar4 = (*args->_vptr->advance)(args);
      if (iVar4 < 1) {
        unaff_R14D = iVar4;
        if (iVar7 == 0) {
          unaff_R14D = iVar7;
        }
        bVar3 = false;
      }
      else {
        iVar7 = iVar7 + 1;
        bVar3 = true;
      }
    }
    if (!bVar3) {
      return unaff_R14D;
    }
  } while( true );
}

Assistant:

extern int mpt_object_args(MPT_INTERFACE(object) *obj, MPT_INTERFACE(iterator) *args)
{
	MPT_STRUCT(property) pr = MPT_PROPERTY_INIT;
	const MPT_STRUCT(value) *val;
	int count;
	
	count = 0;
	while ((val = args->_vptr->value(args))) {
		const void *ptr;
		int res;
		
		if (!val) {
			break;
		}
		pr.name = 0;
		pr.val._type = 0;
		ptr = val->_addr;
		if (MPT_type_isConvertable(val->_type)) {
			MPT_INTERFACE(convertable) *conv = *((void * const *) ptr);
			
			if (conv->_vptr->convert(conv, MPT_ENUM(TypeProperty), &pr) < 0
			 || mpt_object_set_value(obj, pr.name, &pr.val) < 0) {
				pr.val._type = 0;
				conv->_vptr->convert(conv, 's', &pr.name);
			}
		}
		/* value is not assigned via property */
		if (!pr.val._type) {
			char name[256];
			const char *str;
			if (!pr.name && !(pr.name = mpt_data_tostring(&ptr, val->_type, 0))) {
				return count ? count : MPT_ERROR(BadValue);
			}
			/* set non-assign options to default value */
			if (!(str = strchr(pr.name, '='))) {
				MPT_property_set_string(&pr, 0);
			} else {
				size_t len;
				MPT_property_set_string(&pr, str + 1);
				len = str - pr.name;
				if (len >= sizeof(name)) {
					return count ? count : MPT_ERROR(MissingBuffer);
				}
				pr.name = memcpy(name, pr.name, len);
				name[len++] = 0;
			}
			/* assign config */
			if (mpt_object_set_value(obj, pr.name, &pr.val) < 0) {
				return count ? count : MPT_ERROR(BadValue);
			}
		}
		if ((res = args->_vptr->advance(args)) <= 0) {
			return count ? res : count;
		}
		++count;
	}
	return count;
}